

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMovemEaRg<(moira::Instr)77,(moira::Mode)3,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)3,_(moira::Size)4> src;
  Ea<(moira::Mode)3,_(moira::Size)4> local_44;
  
  uVar1 = dasmRead<(moira::Size)2>(this,addr);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Align)(this->tab).raw);
  pSVar2 = StrWriter::operator<<(pSVar2,&local_44);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<(pSVar2,(RegRegList)(u16)uVar1);
  return;
}

Assistant:

void
Moira::dasmMovemEaRg(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = RegRegList ( dasmRead<Word>(addr)       );
    auto src = Op <M,S>   ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}